

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::LoadNewTargetObject(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  Symbol *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  OpCode op;
  
  pSVar1 = funcInfo->newTargetSymbol;
  if (pSVar1 == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x8af,"(newTargetSym)","newTargetSym");
    if (!bVar3) goto LAB_0075e3f6;
    *puVar5 = 0;
  }
  BVar4 = FuncInfo::IsClassConstructor(funcInfo);
  if (BVar4 == 0) {
    bVar3 = FuncInfo::IsGlobalFunction(funcInfo);
    if (bVar3) {
      op = LdUndef;
    }
    else {
      op = LdNewTarget;
    }
    Js::ByteCodeWriter::Reg1(&this->m_writer,op,pSVar1->location);
    return;
  }
  BVar4 = FuncInfo::IsLambda(funcInfo);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x8b3,"(!funcInfo->IsLambda())","!funcInfo->IsLambda()");
    if (!bVar3) {
LAB_0075e3f6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  Js::ByteCodeWriter::ArgIn0(&this->m_writer,pSVar1->location);
  return;
}

Assistant:

void ByteCodeGenerator::LoadNewTargetObject(FuncInfo *funcInfo)
{
    Symbol* newTargetSym = funcInfo->GetNewTargetSymbol();
    Assert(newTargetSym);

    if (funcInfo->IsClassConstructor())
    {
        Assert(!funcInfo->IsLambda());

        m_writer.ArgIn0(newTargetSym->GetLocation());
    }
    else if (funcInfo->IsGlobalFunction())
    {
        m_writer.Reg1(Js::OpCode::LdUndef, newTargetSym->GetLocation());
    }
    else
    {
        m_writer.Reg1(Js::OpCode::LdNewTarget, newTargetSym->GetLocation());
    }
}